

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

unsigned_long __thiscall
fakeit::ActionSequence<unsigned_long>::handleMethodInvocation
          (ActionSequence<unsigned_long> *this,ArgumentsTuple<> *args)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar3;
  unsigned_long uVar4;
  Finally onExit;
  _Any_data local_80;
  code *local_70;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  function<void_()> local_40;
  
  psVar1 = (this->_recordedActions).
           super__Vector_base<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (psVar1->super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  plVar3 = (long *)__dynamic_cast(peVar2,&Destructible::typeinfo,&Action<unsigned_long>::typeinfo,0)
  ;
  if (plVar3 != (long *)0x0) {
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7277:51)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/MatrixManAtYrService[P]hello-cpp-linwin/externalInclude/FakeIt/single_header/boost/fakeit.hpp:7277:51)>
               ::_M_manager;
    local_60._M_unused._M_object = plVar3;
    local_60._8_8_ = this;
    std::function<void_()>::function((function<void_()> *)&local_80,(function<void_()> *)&local_60);
    std::function<void_()>::function(&local_40,(function<void_()> *)&local_80);
    if (local_70 != (code *)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    uVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,args);
    Finally::~Finally((Finally *)&local_40);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return uVar4;
  }
  __cxa_bad_cast();
}

Assistant:

virtual R handleMethodInvocation(ArgumentsTuple<arglist...> & args) override
        {
            std::shared_ptr<Destructible> destructablePtr = _recordedActions.front();
            Destructible &destructable = *destructablePtr;
            Action<R, arglist...> &action = dynamic_cast<Action<R, arglist...> &>(destructable);
            std::function<void()> finallyClause = [&]() -> void {
                if (action.isDone())
                    _recordedActions.erase(_recordedActions.begin());
            };
            Finally onExit(finallyClause);
            return action.invoke(args);
        }